

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

bool LTFlightDataShowAircraft(void)

{
  bool bVar1;
  logLevelTy lVar2;
  _func_void *in_stack_00000018;
  thread *in_stack_00000020;
  thread *in_stack_ffffffffffffffe8;
  thread *in_stack_fffffffffffffff0;
  bool local_1;
  
  bVar1 = std::thread::joinable(in_stack_fffffffffffffff0);
  if (bVar1) {
    local_1 = true;
  }
  else {
    bVar1 = LTFlightDataAnyTrackingChEnabled();
    if (bVar1) {
      bFDMainStop = false;
      std::thread::thread<void(&)(),,void>(in_stack_00000020,in_stack_00000018);
      std::thread::operator=(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
      std::thread::~thread((thread *)0x1c783e);
      lVar2 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar2 < 2) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x3bd,"LTFlightDataShowAircraft",logINFO,"Requesting live flight data online...");
      }
      CreateMsgWindow(8.0,logINFO,"Requesting live flight data online...");
      initTimeBufFilled = -1.0;
      LTFlightDataStartJoinChannels();
      local_1 = true;
    }
    else {
      lVar2 = DataRefs::GetLogLevel(&dataRefs);
      if ((int)lVar2 < 4) {
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
               ,0x3b3,"LTFlightDataShowAircraft",logERR,anon_var_dwarf_69a1b + 4);
      }
      CreateMsgWindow(12.0,logERR,anon_var_dwarf_69a1b + 4);
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool LTFlightDataShowAircraft()
{
    // is there a calculation thread running already? -> just return
    if ( CalcPosThread.joinable() ) return true;
    
    // Verify if there are any enabled, active tracking data channels.
    // If not bail out and inform the user.
    if (!LTFlightDataAnyTrackingChEnabled())
    {
        SHOW_MSG(logERR, ERR_CH_NONE_ACTIVE);
        return false;
    }
    
    // create a new thread for position calculation
    bFDMainStop = false;
    CalcPosThread = std::thread ( LTFlightData::CalcNextPosMain );
    
    // tell the user we do something in the background
    SHOW_MSG(logINFO,
             MSG_REQUESTING_LIVE_FD);
    
    // flag for: as soon as data arrives start buffer countdown
    initTimeBufFilled = -1;
    
    // Start the required communication threads
    LTFlightDataStartJoinChannels();
    
    return true;
}